

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_float.h
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
spvtools::utils::FloatProxy<float>::GetWords
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          FloatProxy<float> *this)

{
  uint32_t uVar1;
  uint_type local_34;
  value_type_conflict2 local_30;
  uint_type local_2c;
  ulong local_28;
  uint_type d;
  FloatProxy<float> *local_18;
  FloatProxy<float> *this_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *words;
  
  d._7_1_ = 0;
  local_18 = this;
  this_local = (FloatProxy<float> *)__return_storage_ptr__;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(__return_storage_ptr__);
  uVar1 = FloatProxyTraits<float>::width();
  if (uVar1 == 0x40) {
    local_2c = data(this);
    local_28 = (ulong)local_2c;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (__return_storage_ptr__,&local_2c);
    local_30 = (value_type_conflict2)(local_28 >> 0x20);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (__return_storage_ptr__,&local_30);
  }
  else {
    local_34 = data(this);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (__return_storage_ptr__,&local_34);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint32_t> GetWords() const {
    std::vector<uint32_t> words;
    if (FloatProxyTraits<T>::width() == 64) {
      FloatProxyTraits<double>::uint_type d = data();
      words.push_back(static_cast<uint32_t>(d));
      words.push_back(static_cast<uint32_t>(d >> 32));
    } else {
      words.push_back(static_cast<uint32_t>(data()));
    }
    return words;
  }